

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void sprintf<int,int>(stringstream *oss,string *fmt,int value,int args)

{
  fmtflags __a;
  _Ios_Fmtflags _Var1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  undefined1 *puVar5;
  long lVar6;
  runtime_error *this;
  undefined4 in_ECX;
  undefined4 in_EDX;
  stringstream *in_RSI;
  ulong uVar7;
  long *in_RDI;
  invalid_argument *e_1;
  size_t afterpos_1;
  int precision;
  invalid_argument *e;
  int width;
  size_t afterpos;
  size_t fpos;
  bool alternateForm;
  size_t pos;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  string *in_stack_fffffffffffffec0;
  string local_e0 [44];
  int local_b4;
  string local_b0 [32];
  long local_90;
  int local_84;
  int local_78;
  string local_68 [36];
  int local_44;
  long local_40;
  char local_31;
  ulong local_30;
  byte local_21;
  ulong uVar8;
  
  uVar8 = 0;
  do {
    uVar7 = uVar8;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar8) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"extra arguments provided to sprintf");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (*pcVar4 == '%') {
      uVar7 = uVar7 + 1;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
      if (*pcVar4 != '%') {
        local_21 = 0;
        local_30 = std::__cxx11::string::find_first_of((char *)in_RSI,0x15a20f);
        break;
      }
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    std::operator<<((ostream *)(in_RDI + 2),*pcVar4);
    uVar8 = uVar7 + 1;
  } while( true );
LAB_00125846:
  if (local_30 <= uVar7) {
LAB_00125957:
    std::__cxx11::string::substr((ulong)local_68,(ulong)in_RSI);
    iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffec0,
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0);
    std::__cxx11::string::~string(local_68);
    local_44 = iVar2;
    local_78 = (int)std::setw(iVar2);
    std::operator<<((ostream *)(in_RDI + 2),(_Setw)local_78);
    lVar6 = local_40 + uVar7;
    local_84 = 0;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (*pcVar4 == '.') {
      lVar6 = lVar6 + 1;
      std::__cxx11::string::substr((ulong)local_b0,(ulong)in_RSI);
      local_84 = std::__cxx11::stoi(in_stack_fffffffffffffec0,
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0)
      ;
      std::__cxx11::string::~string(local_b0);
      local_b4 = (int)std::setprecision(local_84);
      std::operator<<((ostream *)(in_RDI + 2),(_Setprecision)local_b4);
      local_84 = 0;
      lVar6 = local_90 + lVar6;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (((*pcVar4 == 'x') ||
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI), *pcVar4 == 'X')) &&
       (std::ostream::operator<<(in_RDI + 2,std::hex), (local_21 & 1) != 0)) {
      std::ostream::operator<<(in_RDI + 2,std::showbase);
    }
    streamout<int>((stringstream *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                   in_stack_fffffffffffffeb8);
    iVar2 = (int)((ulong)(lVar6 + 1) >> 0x20);
    std::__cxx11::string::substr((ulong)local_e0,(ulong)in_RSI);
    sprintf<int>(in_RSI,(string *)CONCAT44(in_EDX,in_ECX),iVar2);
    std::__cxx11::string::~string(local_e0);
    return;
  }
  puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
  switch(*puVar5) {
  case 0x20:
    break;
  default:
    goto LAB_00125957;
  case 0x23:
    local_21 = 1;
    break;
  case 0x2b:
    std::ostream::operator<<(in_RDI + 2,std::showpos);
    break;
  case 0x2d:
    std::ostream::operator<<(in_RDI + 2,std::left);
    break;
  case 0x30:
    __a = std::ios_base::flags((ios_base *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
    _Var1 = std::operator&(__a,_S_left);
    if (_Var1 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
      local_31 = (char)std::setfill<char>('0');
      std::operator<<(in_RDI + 2,local_31);
    }
  }
  uVar7 = uVar7 + 1;
  goto LAB_00125846;
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}